

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

bool gmath::recoverEuler(Matrix33d *R,double *ax,double *ay,double *az,bool tolerant)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  int iVar1;
  SMatrix<double,_3,_3> *in_RDI;
  byte in_R8B;
  double extraout_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar4;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double e;
  int i;
  double emin;
  int k;
  double pos [8] [3];
  int local_10c;
  double local_108;
  int local_fc;
  double local_f8 [4];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  byte local_29;
  double *local_28;
  double *local_20;
  double *local_18;
  SMatrix<double,_3,_3> *local_10;
  SMatrix<double,_3,_3> *pSVar2;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SMatrix<double,_3,_3>::operator()(in_RDI,0,2);
  std::abs((int)in_RDI);
  if (0.9999999999 <= extraout_XMM0_Qa) {
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,0,2);
    if (dVar3 <= 0.0) {
      *local_18 = 0.0;
      *local_20 = 1.5707963267948966;
      dVar3 = SMatrix<double,_3,_3>::operator()(local_10,1,0);
      dVar3 = asin(dVar3);
      *local_28 = dVar3;
      SMatrix<double,_3,_3>::operator()(local_10,1,1);
      iVar1 = (int)local_10;
      cos(*local_28);
      std::abs(iVar1);
      if (1e-06 < extraout_XMM0_Qa_11) {
        *local_28 = 3.141592653589793 - *local_28;
      }
    }
    else {
      *local_18 = 0.0;
      *local_20 = -1.5707963267948966;
      dVar3 = SMatrix<double,_3,_3>::operator()(local_10,1,0);
      dVar3 = asin(dVar3);
      *local_28 = dVar3;
      SMatrix<double,_3,_3>::operator()(local_10,1,1);
      iVar1 = (int)local_10;
      cos(*local_28);
      std::abs(iVar1);
      if (1e-06 < extraout_XMM0_Qa_10) {
        *local_28 = 3.141592653589793 - *local_28;
      }
    }
    goto LAB_001b7104;
  }
  dVar3 = SMatrix<double,_3,_3>::operator()(local_10,0,2);
  local_f8[1] = asin(-dVar3);
  local_90 = 3.141592653589793 - local_f8[1];
  pSVar2 = local_10;
  local_d8 = local_f8[1];
  local_c0 = local_f8[1];
  local_a8 = local_f8[1];
  local_78 = local_90;
  local_60 = local_90;
  local_48 = local_90;
  SMatrix<double,_3,_3>::operator()(local_10,1,2);
  iVar1 = (int)pSVar2;
  cos(local_f8[1]);
  std::abs(iVar1);
  if (extraout_XMM0_Qa_00 <= 1.0) {
LAB_001b62e6:
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,1,2);
    dVar4 = cos(local_f8[1]);
    local_f8[0] = asin(-dVar3 / dVar4);
    local_c8 = 3.141592653589793 - local_f8[0];
    local_f8[3] = local_f8[0];
    local_b0 = local_c8;
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,1,2);
    dVar4 = cos(local_90);
    local_80 = asin(-dVar3 / dVar4);
  }
  else {
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,1,2);
    iVar1 = (int)pSVar2;
    cos(local_90);
    std::abs(iVar1);
    if (extraout_XMM0_Qa_01 <= 1.0) goto LAB_001b62e6;
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,2,2);
    dVar4 = cos(local_f8[1]);
    local_f8[0] = acos(dVar3 / dVar4);
    local_c8 = 3.141592653589793 - local_f8[0];
    local_f8[3] = local_f8[0];
    local_b0 = local_c8;
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,2,2);
    dVar4 = cos(local_90);
    local_80 = acos(dVar3 / dVar4);
  }
  local_50 = 3.141592653589793 - local_80;
  pSVar2 = local_10;
  local_98 = local_80;
  local_68 = local_50;
  SMatrix<double,_3,_3>::operator()(local_10,0,1);
  iVar1 = (int)pSVar2;
  cos(local_f8[1]);
  std::abs(iVar1);
  if (extraout_XMM0_Qa_02 <= 1.0) {
LAB_001b6599:
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,0,1);
    dVar4 = cos(local_f8[1]);
    local_f8[2] = asin(-dVar3 / dVar4);
    local_d0 = 3.141592653589793 - local_f8[2];
    local_b8 = local_f8[2];
    local_a0 = local_d0;
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,0,1);
    dVar4 = cos(local_90);
    local_58 = asin(-dVar3 / dVar4);
    local_88 = local_58;
    local_40 = 3.141592653589793 - local_58;
    local_70 = 3.141592653589793 - local_58;
  }
  else {
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,0,1);
    iVar1 = (int)pSVar2;
    cos(local_90);
    std::abs(iVar1);
    if (extraout_XMM0_Qa_03 <= 1.0) goto LAB_001b6599;
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,0,0);
    dVar4 = cos(local_f8[1]);
    local_f8[2] = acos(dVar3 / dVar4);
    local_d0 = 3.141592653589793 - local_f8[2];
    local_b8 = local_f8[2];
    local_a0 = local_d0;
    dVar3 = SMatrix<double,_3,_3>::operator()(local_10,0,0);
    dVar4 = cos(local_90);
    local_58 = acos(dVar3 / dVar4);
    local_88 = local_58;
    local_40 = 3.141592653589793 - local_58;
    local_70 = 3.141592653589793 - local_58;
  }
  local_fc = -1;
  local_108 = 0.0;
  local_88 = local_58;
  local_70 = local_40;
  for (local_10c = 0; local_10c < 8; local_10c = local_10c + 1) {
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,0,0);
    iVar1 = (int)pSVar2;
    cos(local_f8[(long)local_10c * 3 + 1]);
    cos(local_f8[(long)local_10c * 3 + 2]);
    std::abs(iVar1);
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,2,2);
    iVar1 = (int)pSVar2;
    cos(local_f8[(long)local_10c * 3]);
    cos(local_f8[(long)local_10c * 3 + 1]);
    std::abs(iVar1);
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,1,0);
    iVar1 = (int)pSVar2;
    sin(local_f8[(long)local_10c * 3]);
    sin(local_f8[(long)local_10c * 3 + 1]);
    cos(local_f8[(long)local_10c * 3 + 2]);
    cos(local_f8[(long)local_10c * 3]);
    sin(local_f8[(long)local_10c * 3 + 2]);
    std::abs(iVar1);
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,1,1);
    iVar1 = (int)pSVar2;
    sin(local_f8[(long)local_10c * 3]);
    sin(local_f8[(long)local_10c * 3 + 1]);
    sin(local_f8[(long)local_10c * 3 + 2]);
    cos(local_f8[(long)local_10c * 3]);
    cos(local_f8[(long)local_10c * 3 + 2]);
    std::abs(iVar1);
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,2,0);
    iVar1 = (int)pSVar2;
    cos(local_f8[(long)local_10c * 3]);
    sin(local_f8[(long)local_10c * 3 + 1]);
    cos(local_f8[(long)local_10c * 3 + 2]);
    sin(local_f8[(long)local_10c * 3]);
    sin(local_f8[(long)local_10c * 3 + 2]);
    std::abs(iVar1);
    pSVar2 = local_10;
    SMatrix<double,_3,_3>::operator()(local_10,2,1);
    iVar1 = (int)pSVar2;
    cos(local_f8[(long)local_10c * 3]);
    sin(local_f8[(long)local_10c * 3 + 1]);
    sin(local_f8[(long)local_10c * 3 + 2]);
    sin(local_f8[(long)local_10c * 3]);
    cos(local_f8[(long)local_10c * 3 + 2]);
    std::abs(iVar1);
    dVar3 = extraout_XMM0_Qa_09 +
            extraout_XMM0_Qa_08 +
            extraout_XMM0_Qa_07 + extraout_XMM0_Qa_06 + extraout_XMM0_Qa_05 + extraout_XMM0_Qa_04;
    if ((local_fc < 0) || (dVar3 < local_108)) {
      local_fc = local_10c;
      local_108 = dVar3;
    }
  }
  if (((local_29 & 1) == 0) && (1e-06 < local_108)) {
    return false;
  }
  *local_18 = local_f8[(long)local_fc * 3];
  *local_20 = local_f8[(long)local_fc * 3 + 1];
  *local_28 = local_f8[(long)local_fc * 3 + 2];
LAB_001b7104:
  while (*local_18 <= 3.141592653589793) {
    *local_18 = *local_18 + 6.283185307179586;
  }
  while (3.141592653589793 < *local_18) {
    *local_18 = *local_18 - 6.283185307179586;
  }
  while (*local_20 <= 3.141592653589793) {
    *local_20 = *local_20 + 6.283185307179586;
  }
  while (3.141592653589793 < *local_20) {
    *local_20 = *local_20 - 6.283185307179586;
  }
  while (*local_28 <= 3.141592653589793) {
    *local_28 = *local_28 + 6.283185307179586;
  }
  while (3.141592653589793 < *local_28) {
    *local_28 = *local_28 - 6.283185307179586;
  }
  return true;
}

Assistant:

bool recoverEuler(const Matrix33d &R, double &ax, double &ay, double &az, bool tolerant)
{
  // checking if cos(ay) is 0 or not

  if (std::abs(R(0, 2)) < 1.0-1e-10)
  {
    double pos[8][3];

    // cos(ay) is not 0

    // creating 8 possible sets of angles: two possibilities for ay

    pos[0][1]=pos[1][1]=pos[2][1]=pos[3][1]=asin(-R(0, 2));
    pos[4][1]=pos[5][1]=pos[6][1]=pos[7][1]=pi-pos[0][1];

    // for each possibility of ay there are two possibilities of ax

    if (std::abs(R(1, 2)/cos(pos[0][1])) <= 1 || std::abs(R(1, 2)/cos(pos[4][1])) <= 1)
    {
      pos[0][0]=pos[1][0]=asin(-R(1, 2)/cos(pos[0][1]));
      pos[2][0]=pos[3][0]=pi-pos[0][0];

      pos[4][0]=pos[5][0]=asin(-R(1, 2)/cos(pos[4][1]));
      pos[6][0]=pos[7][0]=pi-pos[4][0];
    }
    else
    {
      pos[0][0]=pos[1][0]=acos(R(2, 2)/cos(pos[0][1]));
      pos[2][0]=pos[3][0]=pi-pos[0][0];

      pos[4][0]=pos[5][0]=acos(R(2, 2)/cos(pos[4][1]));
      pos[6][0]=pos[7][0]=pi-pos[4][0];
    }

    // for each possibility of ay there are two possibilities of az as
    // well, which have to be combined with all possibilities of ax

    if (std::abs(R(0, 1)/cos(pos[0][1])) <= 1 || std::abs(R(0, 1)/cos(pos[4][1])) <= 1)
    {
      pos[0][2]=pos[2][2]=asin(-R(0, 1)/cos(pos[0][1]));
      pos[1][2]=pos[3][2]=pi-pos[0][2];

      pos[4][2]=pos[6][2]=asin(-R(0, 1)/cos(pos[4][1]));
      pos[5][2]=pos[7][2]=pi-pos[4][2];
    }
    else
    {
      pos[0][2]=pos[2][2]=acos(R(0, 0)/cos(pos[0][1]));
      pos[1][2]=pos[3][2]=pi-pos[0][2];

      pos[4][2]=pos[6][2]=acos(R(0, 0)/cos(pos[4][1]));
      pos[5][2]=pos[7][2]=pi-pos[4][2];
    }

    // check all 8 possible sets of angles with the remaining 6 equations
    // and use the set with the lowest error

    int k=-1;
    double emin=0;

    for (int i=0; i<8; i++)
    {
      double e;

      e=std::abs(R(0, 0)-cos(pos[i][1])*cos(pos[i][2]));

      e+=std::abs(R(2, 2)-cos(pos[i][0])*cos(pos[i][1]));

      e+=std::abs(R(1, 0)+sin(pos[i][0])*sin(pos[i][1])*
                  cos(pos[i][2])-cos(pos[i][0])*sin(pos[i][2]));

      e+=std::abs(R(1, 1)-sin(pos[i][0])*sin(pos[i][1])*
                  sin(pos[i][2])-cos(pos[i][0])*cos(pos[i][2]));

      e+=std::abs(R(2, 0)-cos(pos[i][0])*sin(pos[i][1])*
                  cos(pos[i][2])-sin(pos[i][0])*sin(pos[i][2]));

      e+=std::abs(R(2, 1)+cos(pos[i][0])*sin(pos[i][1])*
                  sin(pos[i][2])-sin(pos[i][0])*cos(pos[i][2]));

      if (k < 0 || e < emin)
      {
        k=i;
        emin=e;
      }
    }

    if (!tolerant && emin > 1e-6)
    {
      return false;
    }

    ax=pos[k][0];
    ay=pos[k][1];
    az=pos[k][2];
  }
  else
  {
    // cos(ay) is 0

    if (R(0, 2) > 0.0)
    {
      ax=0.0;
      ay=-pi/2.0;
      az=asin(R(1, 0));

      if (std::abs(R(1, 1)-cos(az)) > 1e-6)
      {
        az=pi-az;
      }
    }
    else
    {
      ax=0.0;
      ay=pi/2.0;
      az=asin(R(1, 0));

      if (std::abs(R(1, 1)-cos(az)) > 1e-6)
      {
        az=pi-az;
      }
    }
  }

  // make sure that for all angles -PI < a <= PI

  while (ax <= pi)
  {
    ax+=2.0*pi;
  }

  while (ax > pi)
  {
    ax-=2.0*pi;
  }

  while (ay <= pi)
  {
    ay+=2.0*pi;
  }

  while (ay > pi)
  {
    ay-=2.0*pi;
  }

  while (az <= pi)
  {
    az+=2.0*pi;
  }

  while (az > pi)
  {
    az-=2.0*pi;
  }

  return true;
}